

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

longdouble * __thiscall
baryonyx::itm::compute_delta<long_double,baryonyx::itm::default_cost_type<long_double>>
          (longdouble *__return_storage_ptr__,itm *this,context *ctx,
          default_cost_type<long_double> *c,longdouble theta,int n)

{
  longdouble *extraout_RAX;
  int n_00;
  longdouble in_ST0;
  undefined1 auStack_58 [8];
  longdouble ret;
  longdouble mini;
  uint local_2c;
  undefined1 auStack_28 [4];
  int n_local;
  longdouble theta_local;
  default_cost_type<long_double> *c_local;
  context *ctx_local;
  
  _auStack_28 = theta;
  local_2c = (uint)ctx;
  unique0x10000073 = this;
  c_local = (default_cost_type<long_double> *)__return_storage_ptr__;
  info<>((context *)__return_storage_ptr__,"  - delta not defined, compute it:\n");
  default_cost_type<long_double>::min
            ((longdouble *)stack0xffffffffffffffe8,(default_cost_type<long_double> *)(ulong)local_2c
             ,n_00);
  _auStack_58 = in_ST0 - _auStack_28 * in_ST0;
  info<long_double,long_double,long_double>
            ((context *)c_local,"    - delta={} (min normalized cost:{} / theta: {})\n",
             (longdouble *)auStack_58,(longdouble *)((long)&ret + 8),(longdouble *)auStack_28);
  return extraout_RAX;
}

Assistant:

inline Float
compute_delta(const context& ctx, const Cost& c, Float theta, int n)
{
    info(ctx, "  - delta not defined, compute it:\n");

    const auto mini = c.min(n);
    const auto ret = mini - theta * mini;

    info(ctx,
         "    - delta={} (min normalized cost:{} / theta: {})\n",
         ret,
         mini,
         theta);

    return ret;
}